

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDupDfs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  char *pcVar5;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Abc_NtkIsStrash(pNtk);
    if ((iVar1 != 0) || (iVar1 = Abc_NtkIsNetlist(pNtk), iVar1 != 0)) {
      __assert_fail("!Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x1eb,"Abc_Ntk_t *Abc_NtkDupDfs(Abc_Ntk_t *)");
    }
    pNtk_local = Abc_NtkStartFrom(pNtk,pNtk->ntkType,pNtk->ntkFunc);
    p = Abc_NtkDfs(pNtk,0);
    for (local_3c = 0; iVar1 = Vec_PtrSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,local_3c);
      Abc_NtkDupObj(pNtk_local,pAVar2,0);
    }
    Vec_PtrFree(p);
    for (local_3c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_3c < iVar1; local_3c = local_3c + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_3c);
      if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pAVar2), iVar1 == 0)) &&
         (iVar1 = Abc_ObjIsBo(pAVar2), iVar1 == 0)) {
        for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_40 < iVar1;
            local_40 = local_40 + 1) {
          pAVar3 = Abc_ObjFanin(pAVar2,local_40);
          if (((pAVar2->field_6).pTemp != (void *)0x0) && ((pAVar3->field_6).pTemp != (void *)0x0))
          {
            Abc_ObjAddFanin((pAVar2->field_6).pCopy,(pAVar3->field_6).pCopy);
          }
        }
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar4 = Abc_NtkDup(pNtk->pExdc);
      pNtk_local->pExdc = pAVar4;
    }
    if (pNtk->pExcare != (void *)0x0) {
      pAVar4 = Abc_NtkDup((Abc_Ntk_t *)pNtk->pExcare);
      pNtk_local->pExcare = pAVar4;
    }
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_NtkTimeInitialize(pNtk_local,pNtk);
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Abc_NtkTransferPhases(pNtk_local,pNtk);
    }
    if (pNtk->pWLoadUsed != (char *)0x0) {
      pcVar5 = Abc_UtilStrsav(pNtk->pWLoadUsed);
      pNtk_local->pWLoadUsed = pcVar5;
    }
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkDup(): Network check has failed.\n");
    }
    pNtk->pCopy = pNtk_local;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDupDfs( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( pNtk == NULL )
        return NULL;
    assert( !Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Vec_PtrFree( vNodes );
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pObj->pCopy && pFanin->pCopy )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( pNtk->pExcare )
        pNtkNew->pExcare = Abc_NtkDup( (Abc_Ntk_t *)pNtk->pExcare );
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}